

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_recv(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  connectdata *local_48;
  connectdata *c;
  ssize_t n1;
  size_t *psStack_30;
  CURLcode result;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  Curl_easy *data_local;
  
  psStack_30 = n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = data;
  _Var1 = Curl_is_in_callback(data);
  if (_Var1) {
    data_local._4_4_ = CURLE_RECURSIVE_API_CALL;
  }
  else {
    n1._4_4_ = easy_connection((Curl_easy *)buffer_local,&local_48);
    data_local._4_4_ = n1._4_4_;
    if (n1._4_4_ == CURLE_OK) {
      if (*(long *)((long)buffer_local + 0x18) == 0) {
        Curl_attach_connection((Curl_easy *)buffer_local,local_48);
      }
      *psStack_30 = 0;
      data_local._4_4_ =
           Curl_conn_recv((Curl_easy *)buffer_local,0,(char *)buflen_local,(size_t)n_local,
                          (ssize_t *)&c);
      if (data_local._4_4_ == CURLE_OK) {
        *psStack_30 = (size_t)c;
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_recv(struct Curl_easy *data, void *buffer, size_t buflen,
                        size_t *n)
{
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  result = Curl_conn_recv(data, FIRSTSOCKET, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;
  return CURLE_OK;
}